

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  bool bVar1;
  size_t sVar2;
  String *in_RDI;
  FilePath *in_stack_00000008;
  FilePath parent;
  FilePath *in_stack_00000050;
  bool local_52;
  FilePath *in_stack_ffffffffffffffc0;
  FilePath *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = IsDirectory(in_stack_ffffffffffffffc0);
  if (bVar1) {
    sVar2 = String::length(in_RDI);
    if ((sVar2 == 0) || (bVar1 = DirectoryExists(in_stack_00000050), bVar1)) {
      local_52 = true;
    }
    else {
      RemoveTrailingPathSeparator
                ((FilePath *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      RemoveFileName(in_stack_00000008);
      ~FilePath((FilePath *)0x1563bf);
      bVar1 = CreateDirectoriesRecursively(in_stack_ffffffffffffffe8);
      local_52 = false;
      if (bVar1) {
        local_52 = CreateFolder((FilePath *)in_RDI);
      }
      ~FilePath((FilePath *)0x15640e);
    }
  }
  else {
    local_52 = false;
  }
  return (bool)(local_52 & 1);
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}